

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O1

QRect __thiscall QRectF::toRect(QRectF *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  QRect QVar6;
  
  dVar3 = this->xp;
  dVar1 = (double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3;
  dVar2 = 2147483647.0;
  if (dVar1 <= 2147483647.0) {
    dVar2 = dVar1;
  }
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  QVar6.x1.m_i = (int)dVar2;
  dVar1 = this->yp;
  dVar4 = (double)((ulong)dVar1 & 0x8000000000000000 | 0x3fe0000000000000) + dVar1;
  dVar5 = 2147483647.0;
  if (dVar4 <= 2147483647.0) {
    dVar5 = dVar4;
  }
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  dVar2 = (dVar3 - (double)(int)dVar2) * 0.5 + this->w;
  dVar2 = (double)((ulong)dVar2 & 0x8000000000000000 | 0x3fe0000000000000) + dVar2;
  dVar3 = 2147483647.0;
  if (dVar2 <= 2147483647.0) {
    dVar3 = dVar2;
  }
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  dVar1 = (dVar1 - (double)(int)dVar5) * 0.5 + this->h;
  dVar1 = (double)((ulong)dVar1 & 0x8000000000000000 | 0x3fe0000000000000) + dVar1;
  dVar2 = 2147483647.0;
  if (dVar1 <= 2147483647.0) {
    dVar2 = dVar1;
  }
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  QVar6.x2.m_i = (int)dVar3 + QVar6.x1.m_i + -1;
  QVar6.y1.m_i = (int)dVar5;
  QVar6.y2.m_i = (int)dVar2 + (int)dVar5 + -1;
  return QVar6;
}

Assistant:

constexpr inline QRect QRectF::toRect() const noexcept
{
    // This rounding is designed to minimize the maximum possible difference
    // in topLeft(), bottomRight(), and size() after rounding.
    // All dimensions are at most off by 0.75, and topLeft by at most 0.5.
    const int nxp = QtPrivate::qSaturateRound(xp);
    const int nyp = QtPrivate::qSaturateRound(yp);
    const int nw = QtPrivate::qSaturateRound(w + (xp - nxp) / 2);
    const int nh = QtPrivate::qSaturateRound(h + (yp - nyp) / 2);
    return QRect(nxp, nyp, nw, nh);
}